

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O0

void __thiscall
random_tests::fastrandom_tests_deterministic::test_method(fastrandom_tests_deterministic *this)

{
  long lVar1;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> range;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> range_00;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> range_01;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> range_02;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> range_03;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> range_04;
  duration range_05;
  duration range_06;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe358;
  lazy_ostream *in_stack_ffffffffffffe360;
  char *in_stack_ffffffffffffe368;
  undefined4 in_stack_ffffffffffffe370;
  SeedRand in_stack_ffffffffffffe374;
  undefined7 in_stack_ffffffffffffe378;
  undefined1 in_stack_ffffffffffffe37f;
  const_string *in_stack_ffffffffffffe380;
  hours in_stack_ffffffffffffe388;
  lazy_ostream *in_stack_ffffffffffffe390;
  duration in_stack_ffffffffffffe398;
  unit_test_log_t *this_00;
  undefined7 in_stack_ffffffffffffe3a0;
  undefined1 in_stack_ffffffffffffe3a7;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffe3a8;
  fastrandom_tests_deterministic *this_local;
  lazy_ostream local_1710;
  undefined1 local_1700 [16];
  undefined1 local_16f0 [64];
  rep local_16b0;
  rep local_16a0;
  lazy_ostream local_1698;
  undefined1 local_1688 [16];
  undefined1 local_1678 [64];
  const_string local_1638 [2];
  lazy_ostream local_1618 [5];
  assertion_result local_15c8 [2];
  const_string local_1590 [2];
  lazy_ostream local_1570 [2];
  assertion_result local_1550 [2];
  lazy_ostream local_1518;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [64];
  lazy_ostream local_14b8;
  undefined1 local_14a0 [64];
  const_string local_1460 [2];
  lazy_ostream local_1440 [5];
  assertion_result local_13f0 [2];
  lazy_ostream local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [64];
  const_string local_1358 [2];
  lazy_ostream local_1338 [2];
  assertion_result local_1318 [2];
  const_string local_12e0 [2];
  lazy_ostream local_12c0 [5];
  assertion_result local_1270 [2];
  lazy_ostream local_1238;
  undefined1 local_1228 [16];
  undefined1 local_1218 [64];
  lazy_ostream local_11d8;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [64];
  lazy_ostream local_1178;
  undefined1 local_1160 [64];
  lazy_ostream local_1120;
  undefined1 local_1108 [64];
  rep local_10c8;
  duration local_10b8;
  rep local_10b0;
  lazy_ostream local_10a8;
  undefined1 local_1098 [16];
  undefined1 local_1088 [64];
  rep local_1048;
  duration local_1040;
  rep local_1038;
  lazy_ostream local_1030;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined8 local_1000;
  duration local_fd0;
  rep local_fc8;
  lazy_ostream local_fc0;
  undefined1 local_fb0 [16];
  undefined1 local_fa0 [64];
  duration local_f60;
  rep local_f58;
  lazy_ostream local_f50;
  undefined1 local_f40 [16];
  undefined1 local_f30 [64];
  rep local_ef0;
  duration local_ee8;
  rep local_ee0;
  lazy_ostream local_ed8;
  undefined1 local_ec8 [16];
  undefined1 local_eb8 [64];
  duration local_e78;
  rep local_e70;
  lazy_ostream local_e68;
  undefined1 local_e58 [16];
  undefined1 local_e48 [64];
  SteadySeconds time_point;
  lazy_ostream local_dfc;
  rep local_de8;
  rep local_de0;
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [68];
  lazy_ostream local_d84;
  rep local_d70;
  rep local_d68;
  undefined1 local_d60 [16];
  undefined1 local_d50 [64];
  lazy_ostream local_d10;
  undefined1 local_cf8 [64];
  lazy_ostream local_cb8;
  undefined1 local_ca8 [16];
  undefined1 local_c98 [68];
  lazy_ostream local_c54;
  rep local_c40;
  rep local_c38;
  undefined1 local_c30 [16];
  undefined1 local_c20 [64];
  lazy_ostream local_be0;
  rep local_bc8;
  rep local_bc0;
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [64];
  lazy_ostream local_b68;
  undefined1 local_b50 [64];
  lazy_ostream local_b10;
  undefined1 local_b00 [16];
  undefined1 local_af0 [68];
  lazy_ostream local_aac;
  rep local_a98;
  rep local_a90;
  undefined1 local_a88 [16];
  undefined1 local_a78 [68];
  lazy_ostream local_a34;
  rep local_a20;
  rep local_a18;
  undefined1 local_a10 [16];
  undefined1 local_a00 [64];
  lazy_ostream local_9c0;
  undefined1 local_9a8 [64];
  lazy_ostream local_968;
  undefined1 local_958 [16];
  undefined1 local_948 [64];
  FastRandomContext ctx_1;
  FastRandomContext ctx;
  FastRandomContext ctx2;
  FastRandomContext ctx1;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest
            ((BasicTestingSetup *)CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
             in_stack_ffffffffffffe374);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_ffffffffffffe368,
             SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_ffffffffffffe368,
             SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_968._8_8_ =
         RandomMixin<FastRandomContext>::rand<unsigned_long>
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_968._vptr_lazy_ostream = (_func_int **)0x817c4df1d77c8518;
    in_stack_ffffffffffffe368 = "uint64_t{9330418229102544152u}";
    in_stack_ffffffffffffe360 = &local_968;
    in_stack_ffffffffffffe358 = "FastRandomContext().rand<uint64_t>()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_948,local_958,0x1f,1,2,&local_968.m_empty);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_9c0._vptr_lazy_ostream._4_4_ =
         RandomMixin<FastRandomContext>::rand<int>
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_9c0._vptr_lazy_ostream._0_4_ = 0x24e40c69;
    in_stack_ffffffffffffe368 = "int{618925161}";
    in_stack_ffffffffffffe360 = &local_9c0;
    in_stack_ffffffffffffe358 = "FastRandomContext().rand<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_9a8,&local_9c0.m_empty,0x20,1,2,
               (undefined1 *)((long)&local_9c0._vptr_lazy_ostream + 4));
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_a34._4_8_ = h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range.__r._4_4_ = in_stack_ffffffffffffe374;
    range.__r._0_4_ = in_stack_ffffffffffffe370;
    local_a20 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                               ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe360,range);
    local_a18 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe358);
    local_a34._vptr_lazy_ostream._0_4_ = 0x4bc48769;
    in_stack_ffffffffffffe368 = "1271170921";
    in_stack_ffffffffffffe360 = &local_a34;
    in_stack_ffffffffffffe358 =
         "FastRandomContext().randrange<std::chrono::microseconds>(1h).count()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_a00,local_a10,0x21,1,2,&local_a18);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_aac._4_8_ = h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range_00.__r._4_4_ = in_stack_ffffffffffffe374;
    range_00.__r._0_4_ = in_stack_ffffffffffffe370;
    local_a98 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                               ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe360,range_00
                               );
    local_a90 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffe358);
    local_aac._vptr_lazy_ostream._0_4_ = 0x2ac74e;
    in_stack_ffffffffffffe368 = "2803534";
    in_stack_ffffffffffffe360 = &local_aac;
    in_stack_ffffffffffffe358 =
         "FastRandomContext().randrange<std::chrono::milliseconds>(1h).count()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_a78,local_a88,0x22,1,2,&local_a90);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_b10._8_8_ =
         RandomMixin<FastRandomContext>::rand<unsigned_long>
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_b10._vptr_lazy_ostream = (_func_int **)0x8d2695759f656366;
    in_stack_ffffffffffffe368 = "uint64_t{10170981140880778086u}";
    in_stack_ffffffffffffe360 = &local_b10;
    in_stack_ffffffffffffe358 = "FastRandomContext().rand<uint64_t>()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_af0,local_b00,0x24,1,2,&local_b10.m_empty);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_b68._vptr_lazy_ostream._4_4_ =
         RandomMixin<FastRandomContext>::rand<int>
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_b68._vptr_lazy_ostream._0_4_ = 0x64ad5b65;
    in_stack_ffffffffffffe368 = "int{1689082725}";
    in_stack_ffffffffffffe360 = &local_b68;
    in_stack_ffffffffffffe358 = "FastRandomContext().rand<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b50,&local_b68.m_empty,0x25,1,2,
               (undefined1 *)((long)&local_b68._vptr_lazy_ostream + 4));
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_be0._8_8_ = h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range_01.__r._4_4_ = in_stack_ffffffffffffe374;
    range_01.__r._0_4_ = in_stack_ffffffffffffe370;
    local_bc8 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                               ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe360,range_01
                               );
    local_bc0 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe358);
    local_be0._vptr_lazy_ostream = (_func_int **)0x92e77a84;
    in_stack_ffffffffffffe368 = "2464643716";
    in_stack_ffffffffffffe360 = &local_be0;
    in_stack_ffffffffffffe358 =
         "FastRandomContext().randrange<std::chrono::microseconds>(1h).count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_ba8,local_bb8,0x26,1,2,&local_bc0);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_c54._4_8_ = h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range_02.__r._4_4_ = in_stack_ffffffffffffe374;
    range_02.__r._0_4_ = in_stack_ffffffffffffe370;
    local_c40 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                               ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe360,range_02
                               );
    local_c38 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffe358);
    local_c54._vptr_lazy_ostream._0_4_ = 0x23480d;
    in_stack_ffffffffffffe368 = "2312205";
    in_stack_ffffffffffffe360 = &local_c54;
    in_stack_ffffffffffffe358 =
         "FastRandomContext().randrange<std::chrono::milliseconds>(1h).count()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_c20,local_c30,0x27,1,2,&local_c38);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_cb8._8_8_ =
         RandomMixin<FastRandomContext>::rand<unsigned_long>
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_cb8._vptr_lazy_ostream = (_func_int **)0x4ef4d2cc5d4fdd77;
    in_stack_ffffffffffffe368 = "uint64_t{5689404004456455543u}";
    in_stack_ffffffffffffe360 = &local_cb8;
    in_stack_ffffffffffffe358 = "FastRandomContext().rand<uint64_t>()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_c98,local_ca8,0x29,1,2,&local_cb8.m_empty);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_d10._vptr_lazy_ostream._4_4_ =
         RandomMixin<FastRandomContext>::rand<int>
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_d10._vptr_lazy_ostream._0_4_ = 0x2ed6f741;
    in_stack_ffffffffffffe368 = "int{785839937}";
    in_stack_ffffffffffffe360 = &local_d10;
    in_stack_ffffffffffffe358 = "FastRandomContext().rand<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_cf8,&local_d10.m_empty,0x2a,1,2,
               (undefined1 *)((long)&local_d10._vptr_lazy_ostream + 4));
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_d84._4_8_ = h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range_03.__r._4_4_ = in_stack_ffffffffffffe374;
    range_03.__r._0_4_ = in_stack_ffffffffffffe370;
    local_d70 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                               ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe360,range_03
                               );
    local_d68 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe358);
    local_d84._vptr_lazy_ostream._0_4_ = 0x5939814;
    in_stack_ffffffffffffe368 = "93558804";
    in_stack_ffffffffffffe360 = &local_d84;
    in_stack_ffffffffffffe358 =
         "FastRandomContext().randrange<std::chrono::microseconds>(1h).count()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_d50,local_d60,0x2b,1,2,&local_d68);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    local_dfc._4_8_ = h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range_04.__r._4_4_ = in_stack_ffffffffffffe374;
    range_04.__r._0_4_ = in_stack_ffffffffffffe370;
    local_de8 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                               ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe360,range_04
                               );
    local_de0 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffe358);
    local_dfc._vptr_lazy_ostream._0_4_ = 0x7bc8e;
    in_stack_ffffffffffffe368 = "507022";
    in_stack_ffffffffffffe360 = &local_dfc;
    in_stack_ffffffffffffe358 =
         "FastRandomContext().randrange<std::chrono::milliseconds>(1h).count()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_dc8,local_dd8,0x2c,1,2,&local_de0);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  time_point.__d.__r = (duration)1;
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_ffffffffffffe368,
             SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_e68._12_4_ = 7;
    s<(char)57>();
    local_e78.__r =
         (rep)RandomMixin<FastRandomContext>::
              rand_uniform_delay<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                         in_stack_ffffffffffffe398);
    local_e70 = (rep)std::chrono::
                     time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                     ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                         *)in_stack_ffffffffffffe360);
    local_e68._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx.rand_uniform_delay(time_point, 9s).time_since_epoch().count()";
    in_stack_ffffffffffffe360 = &local_e68;
    in_stack_ffffffffffffe358 = "7";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_e48,local_e58,0x32,1,2,&local_e68.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_ed8._12_4_ = 0xfffffffa;
    local_ef0 = (rep)s<(char)57>();
    std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    local_ee8.__r =
         (rep)RandomMixin<FastRandomContext>::
              rand_uniform_delay<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                         in_stack_ffffffffffffe398);
    local_ee0 = (rep)std::chrono::
                     time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                     ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                         *)in_stack_ffffffffffffe360);
    local_ed8._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx.rand_uniform_delay(time_point, -9s).time_since_epoch().count()"
    ;
    in_stack_ffffffffffffe360 = &local_ed8;
    in_stack_ffffffffffffe358 = "-6";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_eb8,local_ec8,0x33,1,2,&local_ed8.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_f50._12_4_ = 1;
    s<(char)48>();
    local_f60.__r =
         (rep)RandomMixin<FastRandomContext>::
              rand_uniform_delay<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                         in_stack_ffffffffffffe398);
    local_f58 = (rep)std::chrono::
                     time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                     ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                         *)in_stack_ffffffffffffe360);
    local_f50._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx.rand_uniform_delay(time_point, 0s).time_since_epoch().count()";
    in_stack_ffffffffffffe360 = &local_f50;
    in_stack_ffffffffffffe358 = "1";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_f30,local_f40,0x34,1,2,&local_f50.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_fc0.m_empty = true;
    local_fc0._9_7_ = 0x40903df1a0ade0;
    s<(char)57,(char)50,(char)50,(char)51,(char)51,(char)55,(char)50,(char)48,(char)51,(char)54,(char)56,(char)53,(char)52,(char)55,(char)55,(char)53,(char)56,(char)48,(char)55>
              ();
    local_fd0.__r =
         (rep)RandomMixin<FastRandomContext>::
              rand_uniform_delay<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                         in_stack_ffffffffffffe398);
    local_fc8 = (rep)std::chrono::
                     time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                     ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                         *)in_stack_ffffffffffffe360);
    local_fc0._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 =
         "ctx.rand_uniform_delay(time_point, 9223372036854775807s).time_since_epoch().count()";
    in_stack_ffffffffffffe360 = &local_fc0;
    in_stack_ffffffffffffe358 = "4652286523065884857";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_fa0,local_fb0,0x35,1,2,&local_fc0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1030.m_empty = true;
    local_1030._9_7_ = 0x85ae84f358352b;
    local_1048 = (rep)s<(char)57,(char)50,(char)50,(char)51,(char)51,(char)55,(char)50,(char)48,(char)51,(char)54,(char)56,(char)53,(char)52,(char)55,(char)55,(char)53,(char)56,(char)48,(char)55>
                                ();
    std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    local_1040.__r =
         (rep)RandomMixin<FastRandomContext>::
              rand_uniform_delay<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                         in_stack_ffffffffffffe398);
    local_1038 = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                          *)in_stack_ffffffffffffe360);
    local_1030._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 =
         "ctx.rand_uniform_delay(time_point, -9223372036854775807s).time_since_epoch().count()";
    in_stack_ffffffffffffe360 = &local_1030;
    in_stack_ffffffffffffe358 = "-8813961240025683129";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1010,local_1020,0x36,1,2,&local_1030.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_10a8._12_4_ = 0x674b;
    local_10c8 = (rep)h<(char)57>();
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    local_10b8.__r =
         (rep)RandomMixin<FastRandomContext>::
              rand_uniform_delay<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                         in_stack_ffffffffffffe398);
    local_10b0 = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                          *)in_stack_ffffffffffffe360);
    local_10a8._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx.rand_uniform_delay(time_point, 9h).time_since_epoch().count()";
    in_stack_ffffffffffffe360 = &local_10a8;
    in_stack_ffffffffffffe358 = "26443";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_1088,local_1098,0x37,1,2,&local_10a8.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1120._vptr_lazy_ostream._4_4_ =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_1120._vptr_lazy_ostream._0_4_ =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx2.rand32()";
    in_stack_ffffffffffffe360 = &local_1120;
    in_stack_ffffffffffffe358 = "ctx1.rand32()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1108,&local_1120.m_empty,0x39,1,2,
               (undefined1 *)((long)&local_1120._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1178._vptr_lazy_ostream._4_4_ =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_1178._vptr_lazy_ostream._0_4_ =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx2.rand32()";
    in_stack_ffffffffffffe360 = &local_1178;
    in_stack_ffffffffffffe358 = "ctx1.rand32()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1160,&local_1178.m_empty,0x3a,1,2,
               (undefined1 *)((long)&local_1178._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_11d8._8_8_ =
         FastRandomContext::rand64
                   ((FastRandomContext *)
                    CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370));
    local_11d8._vptr_lazy_ostream =
         (_func_int **)
         FastRandomContext::rand64
                   ((FastRandomContext *)
                    CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370));
    in_stack_ffffffffffffe368 = "ctx2.rand64()";
    in_stack_ffffffffffffe360 = &local_11d8;
    in_stack_ffffffffffffe358 = "ctx1.rand64()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_11b8,local_11c8,0x3b,1,2,&local_11d8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1238._8_8_ =
         RandomMixin<FastRandomContext>::randbits
                   ((RandomMixin<FastRandomContext> *)
                    CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                    in_stack_ffffffffffffe374);
    local_1238._vptr_lazy_ostream =
         (_func_int **)
         RandomMixin<FastRandomContext>::randbits
                   ((RandomMixin<FastRandomContext> *)
                    CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                    in_stack_ffffffffffffe374);
    in_stack_ffffffffffffe368 = "ctx2.randbits(3)";
    in_stack_ffffffffffffe360 = &local_1238;
    in_stack_ffffffffffffe358 = "ctx1.randbits(3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1218,local_1228,0x3c,1,2,&local_1238.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_ffffffffffffe3a8,
               CONCAT17(in_stack_ffffffffffffe3a7,in_stack_ffffffffffffe3a0));
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_ffffffffffffe3a8,
               CONCAT17(in_stack_ffffffffffffe3a7,in_stack_ffffffffffffe3a0));
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffe388.__r,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffe380);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe360,(basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe358 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1270,local_12c0,local_12e0,0x3d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe358);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe358);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe368);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe368);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe388.__r);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe388.__r);
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffe368,
                 (base_blob<256U> *)in_stack_ffffffffffffe360);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe360,(basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe358 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1318,local_1338,local_1358,0x3e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe358);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_13b8._8_8_ =
         RandomMixin<FastRandomContext>::randbits
                   ((RandomMixin<FastRandomContext> *)
                    CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                    in_stack_ffffffffffffe374);
    local_13b8._vptr_lazy_ostream =
         (_func_int **)
         RandomMixin<FastRandomContext>::randbits
                   ((RandomMixin<FastRandomContext> *)
                    CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                    in_stack_ffffffffffffe374);
    in_stack_ffffffffffffe368 = "ctx2.randbits(7)";
    in_stack_ffffffffffffe360 = &local_13b8;
    in_stack_ffffffffffffe358 = "ctx1.randbits(7)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1398,local_13a8,0x3f,1,2,&local_13b8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_ffffffffffffe3a8,
               CONCAT17(in_stack_ffffffffffffe3a7,in_stack_ffffffffffffe3a0));
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_ffffffffffffe3a8,
               CONCAT17(in_stack_ffffffffffffe3a7,in_stack_ffffffffffffe3a0));
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffe388.__r,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffe380);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe360,(basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe358 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13f0,local_1440,local_1460,0x40,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe358);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe358);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe368);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe368);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_14b8._vptr_lazy_ostream._4_4_ =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    local_14b8._vptr_lazy_ostream._0_4_ =
         RandomMixin<FastRandomContext>::rand32
                   ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx2.rand32()";
    in_stack_ffffffffffffe360 = &local_14b8;
    in_stack_ffffffffffffe358 = "ctx1.rand32()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_14a0,&local_14b8.m_empty,0x41,1,2,
               (undefined1 *)((long)&local_14b8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1518._8_8_ =
         RandomMixin<FastRandomContext>::randbits
                   ((RandomMixin<FastRandomContext> *)
                    CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                    in_stack_ffffffffffffe374);
    local_1518._vptr_lazy_ostream =
         (_func_int **)
         RandomMixin<FastRandomContext>::randbits
                   ((RandomMixin<FastRandomContext> *)
                    CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                    in_stack_ffffffffffffe374);
    in_stack_ffffffffffffe368 = "ctx2.randbits(3)";
    in_stack_ffffffffffffe360 = &local_1518;
    in_stack_ffffffffffffe358 = "ctx1.randbits(3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_14f8,local_1508,0x42,1,2,&local_1518.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe388.__r);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe388.__r);
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffe368,
                 (base_blob<256U> *)in_stack_ffffffffffffe360);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe360,(basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe358 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1550,local_1570,local_1590,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe358);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_ffffffffffffe3a8,
               CONCAT17(in_stack_ffffffffffffe3a7,in_stack_ffffffffffffe3a0));
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_ffffffffffffe3a8,
               CONCAT17(in_stack_ffffffffffffe3a7,in_stack_ffffffffffffe3a0));
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffe388.__r,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffe380);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe368,
               SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe360,(basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe358 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_15c8,local_1618,local_1638,0x44,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe358);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe358);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe368);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe368);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_ffffffffffffe368,
             SUB81((ulong)in_stack_ffffffffffffe360 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe398.__r,
               (const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1698._12_4_ = 0xb876;
    local_16b0 = (rep)s<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    range_05.__r._7_1_ = in_stack_ffffffffffffe3a7;
    range_05.__r._0_7_ = in_stack_ffffffffffffe3a0;
    local_16a0 = (rep)RandomMixin<FastRandomContext>::rand_uniform_duration<MicroClock>
                                ((RandomMixin<FastRandomContext> *)
                                 CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),
                                 range_05);
    local_1698._vptr_lazy_ostream =
         (_func_int **)
         std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                   ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx.rand_uniform_duration<MicroClock>(1s).count()";
    in_stack_ffffffffffffe360 = &local_1698;
    in_stack_ffffffffffffe358 = "47222";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_1678,local_1688,0x4b,1,2,&local_1698.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe3a7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe3a7);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe358);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388.__r,
               in_stack_ffffffffffffe380);
    in_stack_ffffffffffffe390 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe360,(char (*) [1])in_stack_ffffffffffffe358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe368,
               (pointer)in_stack_ffffffffffffe360,(unsigned_long)in_stack_ffffffffffffe358);
    local_1710._12_4_ = 0xade;
    in_stack_ffffffffffffe388 = h<(char)57>();
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe360,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffe358);
    range_06.__r._7_1_ = in_stack_ffffffffffffe3a7;
    range_06.__r._0_7_ = in_stack_ffffffffffffe3a0;
    RandomMixin<FastRandomContext>::
    rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              ((RandomMixin<FastRandomContext> *)
               CONCAT17(in_stack_ffffffffffffe37f,in_stack_ffffffffffffe378),range_06);
    in_stack_ffffffffffffe380 =
         (const_string *)
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe368 = "ctx.rand_uniform_duration<SteadySeconds>(9h).count()";
    in_stack_ffffffffffffe360 = &local_1710;
    in_stack_ffffffffffffe358 = "2782";
    local_1710._vptr_lazy_ostream = (_func_int **)in_stack_ffffffffffffe380;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_16f0,local_1700,0x4d,1,2,&local_1710.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe358);
    in_stack_ffffffffffffe37f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe37f);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffe358);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_tests_deterministic)
{
    // Check that deterministic FastRandomContexts are deterministic
    SeedRandomForTest(SeedRand::ZEROS);
    FastRandomContext ctx1{true};
    FastRandomContext ctx2{true};

    {
        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{9330418229102544152u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{618925161});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 1271170921);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 2803534);

        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{10170981140880778086u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{1689082725});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 2464643716);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 2312205);

        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{5689404004456455543u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{785839937});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 93558804);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 507022);
    }

    {
        constexpr SteadySeconds time_point{1s};
        FastRandomContext ctx{true};
        BOOST_CHECK_EQUAL(7, ctx.rand_uniform_delay(time_point, 9s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(-6, ctx.rand_uniform_delay(time_point, -9s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(1, ctx.rand_uniform_delay(time_point, 0s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(4652286523065884857, ctx.rand_uniform_delay(time_point, 9223372036854775807s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(-8813961240025683129, ctx.rand_uniform_delay(time_point, -9223372036854775807s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(26443, ctx.rand_uniform_delay(time_point, 9h).time_since_epoch().count());
    }
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.rand64(), ctx2.rand64());
    BOOST_CHECK_EQUAL(ctx1.randbits(3), ctx2.randbits(3));
    BOOST_CHECK(ctx1.randbytes(17) == ctx2.randbytes(17));
    BOOST_CHECK(ctx1.rand256() == ctx2.rand256());
    BOOST_CHECK_EQUAL(ctx1.randbits(7), ctx2.randbits(7));
    BOOST_CHECK(ctx1.randbytes(128) == ctx2.randbytes(128));
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.randbits(3), ctx2.randbits(3));
    BOOST_CHECK(ctx1.rand256() == ctx2.rand256());
    BOOST_CHECK(ctx1.randbytes(50) == ctx2.randbytes(50));
    {
        struct MicroClock {
            using duration = std::chrono::microseconds;
        };
        FastRandomContext ctx{true};
        // Check with clock type
        BOOST_CHECK_EQUAL(47222, ctx.rand_uniform_duration<MicroClock>(1s).count());
        // Check with time-point type
        BOOST_CHECK_EQUAL(2782, ctx.rand_uniform_duration<SteadySeconds>(9h).count());
    }
}